

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_func.cpp
# Opt level: O0

void __thiscall FParser::SF_SetLineTrigger(FParser *this)

{
  uint uVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  undefined1 local_36 [2];
  int f;
  short local_30;
  maplinedef_t mld;
  FLineIdIterator itr;
  int tag;
  int spec;
  int id;
  int i;
  FParser *this_local;
  
  itr.searchtag._0_2_ = 0;
  bVar2 = CheckArgs(this,2);
  if (bVar2) {
    iVar3 = intvalue(this->t_argv);
    iVar4 = intvalue(this->t_argv + 1);
    if (2 < this->t_argc) {
      iVar5 = intvalue(this->t_argv + 2);
      itr.searchtag._0_2_ = (WORD)iVar5;
    }
    FLineIdIterator::FLineIdIterator((FLineIdIterator *)&mld.special,iVar3);
    while (iVar3 = FLineIdIterator::Next((FLineIdIterator *)&mld.special), -1 < iVar3) {
      local_30 = (short)iVar4;
      mld.v1 = (WORD)itr.searchtag;
      f._2_2_ = 0;
      uVar1 = lines[iVar3].flags;
      P_TranslateLineDef((line_t *)(lines + iVar3),(maplinedef_t *)local_36,-1);
      lines[iVar3].flags = lines[iVar3].flags & 0x803e00 | uVar1 & 0xff7fc1ff;
    }
  }
  return;
}

Assistant:

void FParser::SF_SetLineTrigger()
{
	int i,id,spec,tag(0);

	if (CheckArgs(2))
	{
		id=intvalue(t_argv[0]);
		spec=intvalue(t_argv[1]);
		if (t_argc>2) tag=intvalue(t_argv[2]);
		FLineIdIterator itr(id);
		while ((i = itr.Next()) >= 0)
		{
			maplinedef_t mld;
			mld.special = spec;
			mld.tag = tag;
			mld.flags = 0;
			int f = lines[i].flags;
			P_TranslateLineDef(&lines[i], &mld);
			lines[i].flags = (lines[i].flags & (ML_MONSTERSCANACTIVATE | ML_REPEAT_SPECIAL | ML_SPAC_MASK | ML_FIRSTSIDEONLY)) |
				(f & ~(ML_MONSTERSCANACTIVATE | ML_REPEAT_SPECIAL | ML_SPAC_MASK | ML_FIRSTSIDEONLY));

		}
	}
}